

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O3

void __thiscall cmComputeLinkInformation::ComputeLinkTypeInfo(cmComputeLinkInformation *this)

{
  cmState *this_00;
  cmGeneratorTarget *this_01;
  bool bVar1;
  TargetType TVar2;
  LinkType LVar3;
  cmValue cVar4;
  cmValue cVar5;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *pcVar6;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  string_view value;
  string shared_link_type_flag_var;
  string static_link_type_flag_var;
  string local_e8;
  string local_c8;
  string local_a8;
  char *local_88;
  undefined8 local_80;
  undefined8 local_78;
  char *local_70;
  undefined8 local_68;
  size_type local_60;
  pointer local_58;
  undefined8 local_50;
  undefined8 local_48;
  char *local_40;
  undefined8 local_38;
  
  this_00 = (this->CMakeInstance->State)._M_t.
            super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
            super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
            super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a8,"TARGET_ARCHIVES_MAY_BE_SHARED_LIBS","");
  bVar1 = cmState::GetGlobalPropertyAsBool(this_00,&local_a8);
  this->ArchivesMayBeShared = bVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  this->LinkTypeEnabled = false;
  TVar2 = cmGeneratorTarget::GetType(this->Target);
  if (TVar2 == EXECUTABLE) {
    pcVar6 = "EXE";
  }
  else if (TVar2 == SHARED_LIBRARY) {
    pcVar6 = "SHARED_LIBRARY";
  }
  else {
    if (TVar2 != MODULE_LIBRARY) goto LAB_003fecee;
    pcVar6 = "SHARED_MODULE";
  }
  local_a8._M_dataplus._M_p = &DAT_00000006;
  local_a8._M_string_length = 0x7d5d93;
  local_a8.field_2._M_allocated_capacity = 0;
  local_a8.field_2._8_8_ = strlen(pcVar6);
  local_80 = 0;
  local_78 = 0xd;
  local_70 = "_LINK_STATIC_";
  local_68 = 0;
  local_58 = (this->LinkLanguage)._M_dataplus._M_p;
  local_60 = (this->LinkLanguage)._M_string_length;
  local_50 = 0;
  local_48 = 6;
  local_40 = "_FLAGS";
  local_38 = 0;
  views._M_len = 5;
  views._M_array = (iterator)&local_a8;
  local_88 = pcVar6;
  cmCatViews(&local_c8,views);
  cVar4 = cmMakefile::GetDefinition(this->Makefile,&local_c8);
  local_a8._M_dataplus._M_p = &DAT_00000006;
  local_a8._M_string_length = 0x7d5d93;
  local_a8.field_2._M_allocated_capacity = 0;
  local_a8.field_2._8_8_ = strlen(pcVar6);
  local_80 = 0;
  local_78 = 0xe;
  local_70 = "_LINK_DYNAMIC_";
  local_68 = 0;
  local_58 = (this->LinkLanguage)._M_dataplus._M_p;
  local_60 = (this->LinkLanguage)._M_string_length;
  local_50 = 0;
  local_48 = 6;
  local_40 = "_FLAGS";
  local_38 = 0;
  views_00._M_len = 5;
  views_00._M_array = (iterator)&local_a8;
  local_88 = pcVar6;
  cmCatViews(&local_e8,views_00);
  cVar5 = cmMakefile::GetDefinition(this->Makefile,&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  if (((cVar4.Value != (string *)0x0) &&
      (cVar5.Value != (string *)0x0 && (cVar4.Value)->_M_string_length != 0)) &&
     ((cVar5.Value)->_M_string_length != 0)) {
    this->LinkTypeEnabled = true;
    std::__cxx11::string::_M_assign((string *)&this->StaticLinkTypeFlag);
    std::__cxx11::string::_M_assign((string *)&this->SharedLinkTypeFlag);
  }
LAB_003fecee:
  this_01 = this->Target;
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"LINK_SEARCH_START_STATIC","")
  ;
  cVar4 = cmGeneratorTarget::GetProperty(this_01,&local_a8);
  pcVar6 = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    pcVar6 = extraout_RDX_00;
  }
  if (cVar4.Value == (string *)0x0) {
    LVar3 = LinkShared;
  }
  else {
    value._M_str = pcVar6;
    value._M_len = (size_t)((cVar4.Value)->_M_dataplus)._M_p;
    bVar1 = cmValue::IsOn((cmValue *)(cVar4.Value)->_M_string_length,value);
    LVar3 = LinkShared - bVar1;
  }
  this->StartLinkType = LVar3;
  this->CurrentLinkType = LVar3;
  return;
}

Assistant:

void cmComputeLinkInformation::ComputeLinkTypeInfo()
{
  // Check whether archives may actually be shared libraries.
  this->ArchivesMayBeShared =
    this->CMakeInstance->GetState()->GetGlobalPropertyAsBool(
      "TARGET_ARCHIVES_MAY_BE_SHARED_LIBS");

  // First assume we cannot do link type stuff.
  this->LinkTypeEnabled = false;

  // Lookup link type selection flags.
  cmValue static_link_type_flag = nullptr;
  cmValue shared_link_type_flag = nullptr;
  const char* target_type_str = nullptr;
  switch (this->Target->GetType()) {
    case cmStateEnums::EXECUTABLE:
      target_type_str = "EXE";
      break;
    case cmStateEnums::SHARED_LIBRARY:
      target_type_str = "SHARED_LIBRARY";
      break;
    case cmStateEnums::MODULE_LIBRARY:
      target_type_str = "SHARED_MODULE";
      break;
    default:
      break;
  }
  if (target_type_str) {
    std::string static_link_type_flag_var =
      cmStrCat("CMAKE_", target_type_str, "_LINK_STATIC_", this->LinkLanguage,
               "_FLAGS");
    static_link_type_flag =
      this->Makefile->GetDefinition(static_link_type_flag_var);

    std::string shared_link_type_flag_var =
      cmStrCat("CMAKE_", target_type_str, "_LINK_DYNAMIC_", this->LinkLanguage,
               "_FLAGS");
    shared_link_type_flag =
      this->Makefile->GetDefinition(shared_link_type_flag_var);
  }

  // We can support link type switching only if all needed flags are
  // known.
  if (cmNonempty(static_link_type_flag) && cmNonempty(shared_link_type_flag)) {
    this->LinkTypeEnabled = true;
    this->StaticLinkTypeFlag = *static_link_type_flag;
    this->SharedLinkTypeFlag = *shared_link_type_flag;
  }

  // Lookup the starting link type from the target (linked statically?).
  cmValue lss = this->Target->GetProperty("LINK_SEARCH_START_STATIC");
  this->StartLinkType = lss.IsOn() ? LinkStatic : LinkShared;
  this->CurrentLinkType = this->StartLinkType;
}